

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O0

void aeron::defaultErrorHandler(exception *exception)

{
  ostream *poVar1;
  char *pcVar2;
  SourcedException *this;
  bad_cast *anon_var_0;
  SourcedException *sourcedException;
  exception *exception_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  pcVar2 = (char *)(**(code **)(*(long *)exception + 0x10))();
  std::operator<<(poVar1,pcVar2);
  this = (SourcedException *)
         __dynamic_cast(exception,&std::exception::typeinfo,&util::SourcedException::typeinfo,0);
  if (this == (SourcedException *)0x0) {
    __cxa_bad_cast();
  }
  poVar1 = std::operator<<((ostream *)&std::cerr," : ");
  pcVar2 = util::SourcedException::where(this);
  std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

inline void defaultErrorHandler(const std::exception& exception)
{
    std::cerr << "ERROR: " << exception.what();

    try
    {
        const SourcedException& sourcedException = dynamic_cast<const SourcedException&>(exception);
        std::cerr << " : " << sourcedException.where();
    }
    catch (const std::bad_cast&)
    {
        // ignore
    }

    std::cerr << std::endl;
    ::exit(-1);
}